

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costEvaluation
          (QuadraticLikeCost *this,double time,VectorDynSize *state,VectorDynSize *control,
          double *costValue)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  CoeffReturnType CVar4;
  Scalar SVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar9;
  undefined4 uVar10;
  bool isValid;
  ostringstream errorMsg;
  char local_261;
  double local_260;
  PointerType local_258;
  long lStack_250;
  undefined1 local_248;
  PointerType local_240;
  long lStack_238;
  undefined8 local_230;
  double local_220;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_218;
  double local_200;
  PointerType local_1f8;
  long lStack_1f0;
  undefined1 local_1e8;
  PointerType local_1e0;
  long lStack_1d8;
  undefined8 local_1d0;
  PointerType local_1c0;
  long lStack_1b8;
  undefined1 local_1b0;
  Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_80;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_60;
  Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  uVar10 = SUB84(time,0);
  local_261 = '\0';
  peVar1 = (this->m_timeVaryingStateHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_260 = time;
  if (peVar1 == (element_type *)0x0) {
    local_220 = 0.0;
  }
  else {
    iVar6 = (*peVar1->_vptr_TimeVaryingObject[2])(peVar1,&local_261);
    if (local_261 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"Unable to retrieve a valid state hessian at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::MatrixDynSize::cols();
    if (lVar7 != lVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"The state hessian at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9," is not squared.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 != lVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"The hessian at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9," does not match the state dimension.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    toEigen(&local_48,state);
    local_218.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    ._16_1_ = local_48.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_;
    local_218.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = local_48.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    local_218.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_rows.m_value =
         local_48.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    toEigen(&local_80,(MatrixDynSize *)CONCAT44(extraout_var,iVar6));
    local_248 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
    local_258 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_250 = local_218.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_240 = local_80.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_238 = local_80.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_230 = CONCAT71(local_80.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_cols.m_value._1_7_,
                         (undefined1)
                         local_80.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_cols.m_value);
    toEigen(&local_60,state);
    local_1e8 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
    local_1f8 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_1f0 = local_218.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_1e0 = local_240;
    lStack_1d8 = lStack_238;
    local_1d0 = local_230;
    local_1c0 = local_60.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_1b8 = local_60.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_1b0 = local_60.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
    CVar4 = Eigen::
            DenseCoeffsBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0>
            ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0>
                     *)&local_1f8,0);
    local_220 = CVar4 * 0.5 + 0.0;
    uVar10 = SUB84(local_260,0);
  }
  peVar2 = (this->m_timeVaryingStateGradient).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_261 = '\0';
    iVar6 = (*peVar2->_vptr_TimeVaryingObject[2])(uVar10,peVar2,&local_261);
    if (local_261 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"Unable to retrieve a valid state gradient at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    lVar7 = iDynTree::VectorDynSize::size();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 != lVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"The gradient at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9," have dimensions different from the state.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_80,
            (VectorDynSize *)CONCAT44(extraout_var_00,iVar6));
    local_248 = (undefined1)
                local_80.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value;
    local_258 = local_80.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_250 = local_80.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    toEigen(&local_218,state);
    local_1e8 = local_248;
    local_1f8 = local_258;
    lStack_1f0 = lStack_250;
    local_1e0 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_1d8 = local_218.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_1d0 = CONCAT71(local_1d0._1_7_,
                         local_218.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         ._16_1_);
    SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_1f8);
    local_220 = local_220 + SVar5;
    uVar10 = SUB84(local_260,0);
  }
  peVar3 = (this->m_timeVaryingStateCostBias).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_261 = '\0';
    iVar6 = (*peVar3->_vptr_TimeVaryingObject[2])(uVar10,peVar3,&local_261);
    if (local_261 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"Unable to retrieve a valid state cost bias at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    local_220 = local_220 + *(double *)CONCAT44(extraout_var_01,iVar6);
    uVar10 = SUB84(local_260,0);
  }
  peVar1 = (this->m_timeVaryingControlHessian).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_200 = 0.0;
  }
  else {
    local_261 = '\0';
    iVar6 = (*peVar1->_vptr_TimeVaryingObject[2])(uVar10,peVar1,&local_261);
    if (local_261 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"Unable to retrieve a valid control hessian at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::MatrixDynSize::cols();
    if (lVar7 != lVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"The control hessian at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9," is not squared.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    lVar7 = iDynTree::MatrixDynSize::rows();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 != lVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"The hessian at time: ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9," does not match the control dimension.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    toEigen(&local_48,control);
    local_218.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    ._16_1_ = local_48.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._16_1_;
    local_218.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = local_48.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
    local_218.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_rows.m_value =
         local_48.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    toEigen(&local_80,(MatrixDynSize *)CONCAT44(extraout_var_02,iVar6));
    local_230 = CONCAT71(local_80.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_cols.m_value._1_7_,
                         (undefined1)
                         local_80.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         .m_cols.m_value);
    local_240 = local_80.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_238 = local_80.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    toEigen(&local_60,control);
    local_1e8 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
    local_1f8 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_1f0 = local_218.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_1e0 = local_240;
    lStack_1d8 = lStack_238;
    local_1d0 = local_230;
    local_1c0 = local_60.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_1b8 = local_60.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_1b0 = local_60.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                ._16_1_;
    CVar4 = Eigen::
            DenseCoeffsBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0>
            ::coeff((DenseCoeffsBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_0>
                     *)&local_1f8,0);
    local_200 = CVar4 * 0.5 + 0.0;
    uVar10 = SUB84(local_260,0);
  }
  peVar2 = (this->m_timeVaryingControlGradient).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar2 != (element_type *)0x0) {
    local_261 = '\0';
    iVar6 = (*peVar2->_vptr_TimeVaryingObject[2])(uVar10,peVar2,&local_261);
    if (local_261 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"Unable to retrieve a valid control gradient at time: ")
      ;
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    lVar7 = iDynTree::VectorDynSize::size();
    lVar8 = iDynTree::VectorDynSize::size();
    if (lVar7 != lVar8) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"The control hessian at time ");
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9," have dimension different from the control dimension.");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
      goto LAB_001963b3;
    }
    toEigen((Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_80,
            (VectorDynSize *)CONCAT44(extraout_var_03,iVar6));
    local_248 = (undefined1)
                local_80.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value;
    local_258 = local_80.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_250 = local_80.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    toEigen(&local_218,control);
    local_1e8 = local_248;
    local_1f8 = local_258;
    lStack_1f0 = lStack_250;
    local_1e0 = local_218.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
    lStack_1d8 = local_218.
                 super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value;
    local_1d0 = CONCAT71(local_1d0._1_7_,
                         local_218.
                         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                         ._16_1_);
    SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double
                      ((dense_product_base *)&local_1f8);
    local_200 = local_200 + SVar5;
    uVar10 = SUB84(local_260,0);
  }
  peVar3 = (this->m_timeVaryingControlCostBias).
           super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar3 != (element_type *)0x0) {
    local_261 = '\0';
    iVar6 = (*peVar3->_vptr_TimeVaryingObject[2])(uVar10,peVar3,&local_261);
    if (local_261 == '\0') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::operator<<((ostream *)&local_1f8,"Unable to retrieve a valid control cost bias at time: "
                     );
      poVar9 = std::ostream::_M_insert<double>(local_260);
      std::operator<<(poVar9,".");
      std::__cxx11::stringbuf::str();
      iDynTree::reportError("QuadraticLikeCost","costEvaluation",(char *)local_258);
LAB_001963b3:
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      return false;
    }
    local_200 = local_200 + *(double *)CONCAT44(extraout_var_04,iVar6);
  }
  *costValue = local_220 + local_200;
  return true;
}

Assistant:

bool QuadraticLikeCost::costEvaluation(double time,
                                           const iDynTree::VectorDynSize& state,
                                           const iDynTree::VectorDynSize& control,
                                           double& costValue)
        {
            double stateCost = 0, controlCost = 0;

            bool isValid = false;
            if (m_timeVaryingStateHessian) {
                const MatrixDynSize &hessian = m_timeVaryingStateHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the state dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += 0.5 * (toEigen(state).transpose() * toEigen(hessian) * toEigen(state))(0);
            }

            if (m_timeVaryingStateGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingStateGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (state.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The gradient at time: " << time << " have dimensions different from the state.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                stateCost += toEigen(gradient).transpose()*toEigen(state);
            }

            if (m_timeVaryingStateCostBias) {

                isValid = false;
                double stateBias = m_timeVaryingStateCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                stateCost += stateBias;
            }

            if (m_timeVaryingControlHessian) {

                isValid = false;
                const MatrixDynSize &hessian = m_timeVaryingControlHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != control.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += 0.5 * (toEigen(control).transpose() * toEigen(hessian) * toEigen(control))(0);
            }

            if (m_timeVaryingControlGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingControlGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                if (control.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control hessian at time " << time << " have dimension different from the control dimension.";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }
                controlCost += toEigen(gradient).transpose()*toEigen(control);
            }

            if (m_timeVaryingControlCostBias) {

                isValid = false;
                double controlBias = m_timeVaryingControlCostBias->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control cost bias at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costEvaluation", errorMsg.str().c_str());
                    return false;
                }

                controlCost += controlBias;
            }

            costValue = stateCost + controlCost;
            return true;
        }